

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O1

ptr<resp_msg> __thiscall nuraft::raft_server::handle_vote_req(raft_server *this,req_msg *req)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer psVar4;
  ulong uVar5;
  undefined8 uVar6;
  _func_int *p_Var7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  _func_int **pp_Var11;
  long *plVar12;
  int iVar13;
  long lVar14;
  element_type *peVar15;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _List_node_base *p_Var18;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *plVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  ptr<resp_msg> pVar23;
  string local_a0;
  long *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long local_70;
  undefined1 local_68;
  undefined1 local_67;
  ptr<cluster_config> c_conf;
  
  psVar4 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((psVar4 != (pointer)0x0) &&
     (iVar13 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr[1].buff_.
                         super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
     3 < iVar13)) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar13 = *(int *)&req[8].log_entries_.
                      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar13 == 3) {
      local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
      local_70 = CONCAT17(local_70._7_1_,0x72656461656c);
    }
    else if (iVar13 == 2) {
      local_70 = 0x74616469646e6163;
      local_68 = 0x65;
      local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9;
      local_67 = 0;
    }
    else if (iVar13 == 1) {
      local_70 = 0x7265776f6c6c6f66;
      local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
      local_68 = 0;
    }
    else {
      local_70 = 0x4e574f4e4b4e55;
      local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
    }
    uVar1 = *(uint *)(in_RDX + 0x14);
    uVar17 = *(undefined8 *)(in_RDX + 0x20);
    local_80 = &local_70;
    (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x20))(&c_conf);
    uVar5 = (c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            log_idx_;
    uVar6 = *(undefined8 *)(in_RDX + 0x28);
    lVar14 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    msg_if_given_abi_cxx11_
              (&local_a0,
               "[VOTE REQ] my role %s, from peer %d, log term: req %lu / mine %lu\nlast idx: req %lu / mine %lu, term: req %lu / mine %lu\npriority: target %d / mine %d, voted_for %d"
               ,&local_70,(ulong)uVar1,uVar17,uVar5,uVar6,lVar14 + -1,*(undefined8 *)(in_RDX + 8),
               req[9].super_msg_base._vptr_msg_base[1],
               (ulong)*(uint *)&(req->log_entries_).
                                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
               (ulong)*(uint *)((long)&(req->log_entries_).
                                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4),
               (ulong)*(uint *)(req[9].super_msg_base._vptr_msg_base + 2));
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_vote_req",0x122,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
  }
  p_Var7 = req[9].super_msg_base._vptr_msg_base[1];
  uVar2 = *(undefined4 *)(in_RDX + 0x14);
  this->_vptr_raft_server = (_func_int **)0x0;
  peVar15 = (element_type *)operator_new(0xb0);
  (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar15->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_001d2270;
  uVar3 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar15->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var7;
  *(undefined4 *)&(peVar15->bg_append_thread_)._M_id._M_thread = 2;
  *(undefined4 *)((long)&(peVar15->bg_append_thread_)._M_id._M_thread + 4) = uVar3;
  *(undefined4 *)&peVar15->bg_append_ea_ = uVar2;
  (peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_001d22c0;
  (peVar15->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar15->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar15->votes_responded_ = 0;
  peVar15->votes_granted_ = 0;
  (peVar15->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar15->priority_change_timer_).first_event_fired_ = 0;
  (peVar15->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar15->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar15->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar15->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar15->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar15->field_0x31 = 0;
  peVar15->leader_ = (__atomic_base<int>)0x0;
  peVar15->id_ = 0;
  peVar15->my_priority_ = 0;
  *(undefined1 *)&peVar15->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar15;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar15->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar8 = *(ulong *)(in_RDX + 0x20);
  (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x20))(&local_a0);
  uVar9 = *(ulong *)local_a0._M_dataplus._M_p;
  if (uVar9 < uVar8) {
    bVar20 = false;
    _Var16._M_pi = extraout_RDX;
  }
  else {
    lVar14 = *(long *)(in_RDX + 0x20);
    (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x20))(&local_80);
    bVar20 = true;
    _Var16._M_pi = extraout_RDX_00;
    if (lVar14 == *local_80) {
      auVar22 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      _Var16._M_pi = auVar22._8_8_;
      bVar20 = *(ulong *)(in_RDX + 0x28) < auVar22._0_8_ - 1U;
    }
  }
  if ((uVar8 <= uVar9) && (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    _Var16._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
    _Var16._M_pi = extraout_RDX_02;
  }
  if (bVar20 || *(_func_int **)(in_RDX + 8) != req[9].super_msg_base._vptr_msg_base[1]) {
    bVar20 = false;
  }
  else {
    bVar20 = true;
    if (*(int *)(req[9].super_msg_base._vptr_msg_base + 2) != *(int *)(in_RDX + 0x14)) {
      bVar20 = *(int *)(req[9].super_msg_base._vptr_msg_base + 2) == -1;
    }
  }
  bVar21 = *(long *)(in_RDX + 0x40) != *(long *)(in_RDX + 0x38);
  if (((bVar21) &&
      (psVar4 = req[9].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar4 != (pointer)0x0)) &&
     (iVar13 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr[1].buff_.
                         super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
     _Var16._M_pi = extraout_RDX_03, 3 < iVar13)) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a0,"[VOTE REQ] force vote request, will ignore priority");
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_vote_req",0x137,&local_a0);
    _Var16._M_pi = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
      _Var16._M_pi = extraout_RDX_05;
    }
  }
  if (((ulong)req[2].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar21 = true;
    if ((psVar4 != (pointer)0x0) &&
       (iVar13 = (*(code *)(psVar4->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), _Var16._M_pi = extraout_RDX_06, 3 < iVar13)) {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_
                (&local_a0,"[VOTE REQ] this server is catching-up with leader, will ignore priority"
                );
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                        ,"handle_vote_req",0x13c,&local_a0);
      _Var16._M_pi = extraout_RDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
        _Var16._M_pi = extraout_RDX_08;
      }
    }
  }
  if (bVar20) {
    get_config((raft_server *)&c_conf);
    plVar19 = &(c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->servers_;
    _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var18 = (_List_node_base *)plVar19;
    do {
      p_Var18 = (((_List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   *)&p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var18 == (_List_node_base *)plVar19) break;
      bVar20 = true;
      if ((((!bVar21) &&
           (puVar10 = (uint *)p_Var18[1]._M_next, *puVar10 == *(uint *)(in_RDX + 0x14))) &&
          (puVar10[0x13] != 0)) &&
         ((int)puVar10[0x13] <
          *(int *)&(req->log_entries_).
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((psVar4 != (pointer)0x0) &&
           (iVar13 = (*(code *)(psVar4->
                               super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr[1].buff_.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )(), _Var16._M_pi = extraout_RDX_09, 3 < iVar13)) {
          psVar4 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_
                    (&local_a0,"I (%d) could vote for peer %d, but priority %d is lower than %d",
                     (ulong)*(uint *)&(req->log_entries_).
                                      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,(ulong)*puVar10,
                     (ulong)puVar10[0x13],
                     (ulong)*(uint *)&(req->log_entries_).
                                      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
          (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_vote_req",0x150,&local_a0);
          _Var16._M_pi = extraout_RDX_10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
            _Var16._M_pi = extraout_RDX_11;
          }
        }
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT71((int7)((ulong)_Var16._M_pi >> 8),1);
        if (psVar4 == (pointer)0x0) {
          bVar20 = false;
        }
        else {
          iVar13 = (*(code *)(psVar4->
                             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr[1].buff_.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ();
          uVar17 = extraout_RDX_12;
          if (3 < iVar13) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_(&local_a0,"decision: X (deny)\n");
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_vote_req",0x151,&local_a0);
            uVar17 = extraout_RDX_13;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
              uVar17 = extraout_RDX_14;
            }
          }
          bVar20 = false;
          _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT71((int7)((ulong)uVar17 >> 8),1);
        }
      }
    } while (bVar20);
    if (p_Var18 == (_List_node_base *)plVar19) {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((psVar4 != (pointer)0x0) &&
         (iVar13 = (*(code *)(psVar4->
                             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr[1].buff_.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             (), 3 < iVar13)) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  (&local_a0,"decision: O (grant), voted_for %d, term %lu",
                   (ulong)*(uint *)(in_RDX + 0x14),this->_vptr_raft_server[1]);
        (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_req",0x157,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      pp_Var11 = this->_vptr_raft_server;
      auVar22 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      pp_Var11[4] = auVar22._0_8_;
      *(undefined1 *)(pp_Var11 + 6) = 1;
      LOCK();
      pp_Var11 = req[9].super_msg_base._vptr_msg_base + 2;
      uVar2 = *(undefined4 *)pp_Var11;
      *(undefined4 *)pp_Var11 = *(undefined4 *)(in_RDX + 0x14);
      UNLOCK();
      plVar12 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
      (**(code **)(*plVar12 + 0x20))
                (plVar12,req[9].super_msg_base._vptr_msg_base,auVar22._8_8_,uVar2);
      _Var16._M_pi = extraout_RDX_18;
    }
    else {
      if (c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var16._M_pi = _Var16._M_pi & 0xffffffff;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (((ulong)_Var16._M_pi & 1) != 0) goto LAB_00193ec5;
      c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
              super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if ((element_type *)
        c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var16._M_pi = extraout_RDX_19;
    }
  }
  else {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar4 != (pointer)0x0) &&
       (iVar13 = (*(code *)(psVar4->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), _Var16._M_pi = extraout_RDX_15, 3 < iVar13)) {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_(&local_a0,"decision: X (deny), term %lu",this->_vptr_raft_server[1]);
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                        ,"handle_vote_req",0x15c,&local_a0);
      _Var16._M_pi = extraout_RDX_16;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
        _Var16._M_pi = extraout_RDX_17;
      }
    }
  }
LAB_00193ec5:
  pVar23.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var16._M_pi;
  pVar23.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar23.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_vote_req(req_msg& req) {
    p_in("[VOTE REQ] my role %s, from peer %d, "
         "log term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "last idx: req %" PRIu64 " / mine %" PRIu64
         ", term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "priority: target %d / mine %d, voted_for %d",
         srv_role_to_string(role_).c_str(),
         req.get_src(), req.get_last_log_term(), log_store_->last_entry()->get_term(),
         req.get_last_log_idx(), log_store_->next_slot()-1,
         req.get_term(), state_->get_term(),
         target_priority_, my_priority_, state_->get_voted_for());

    ptr<resp_msg> resp( cs_new<resp_msg>
                        ( state_->get_term(),
                          msg_type::request_vote_response,
                          id_,
                          req.get_src() ) );

    bool log_okay =
        req.get_last_log_term() > log_store_->last_entry()->get_term() ||
        ( req.get_last_log_term() == log_store_->last_entry()->get_term() &&
          log_store_->next_slot() - 1 <= req.get_last_log_idx() );

    bool grant =
        req.get_term() == state_->get_term() &&
        log_okay &&
        ( state_->get_voted_for() == req.get_src() ||
          state_->get_voted_for() == -1 );

    bool ignore_priority = false;
    if (req.log_entries().size() > 0) {
        p_in("[VOTE REQ] force vote request, will ignore priority");
        ignore_priority = true;
    }
    if (catching_up_) {
        p_in("[VOTE REQ] this server is catching-up with leader, "
             "will ignore priority");
        ignore_priority = true;
    }

    if (grant) {
        ptr<cluster_config> c_conf = get_config();
        for (auto& entry: c_conf->get_servers()) {
            srv_config* s_conf = entry.get();
            if ( !ignore_priority &&
                 s_conf->get_id() == req.get_src() &&
                 s_conf->get_priority() &&
                 s_conf->get_priority() < target_priority_ ) {
                // NOTE:
                //   If zero-priority member initiates leader election,
                //   that is intentionally triggered by the flag in
                //   `raft_params`. In such case, we don't check the
                //   priority.
                p_in("I (%d) could vote for peer %d, "
                     "but priority %d is lower than %d",
                     id_, s_conf->get_id(),
                     s_conf->get_priority(), target_priority_);
                p_in("decision: X (deny)\n");
                return resp;
            }
        }

        p_in("decision: O (grant), voted_for %d, term %" PRIu64,
             req.get_src(), resp->get_term());
        resp->accept(log_store_->next_slot());
        state_->set_voted_for(req.get_src());
        ctx_->state_mgr_->save_state(*state_);
    } else {
        p_in("decision: X (deny), term %" PRIu64, resp->get_term());
    }

    return resp;
}